

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O2

bool __thiscall RTIMUBMX055::IMUInit(RTIMUBMX055 *this)

{
  RTIMUSettings *this_00;
  bool bVar1;
  undefined8 in_RAX;
  uchar uVar2;
  int iVar3;
  undefined8 uStack_38;
  uchar result;
  
  this->m_firstTime = true;
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  this_00 = (this->super_RTIMU).m_settings;
  uVar2 = this_00->m_I2CSlaveAddress;
  this->m_gyroSlaveAddr = uVar2;
  uStack_38 = in_RAX;
  bVar1 = RTIMUHal::HALRead(&this_00->super_RTIMUHal,uVar2,'\0','\x01',&result,
                            "Failed to read BMX055 gyro id");
  if (bVar1) {
    if (result == '\x0f') {
      bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\x18','\0','\x01'
                                ,&result,"");
      if (bVar1) {
        this->m_accelSlaveAddr = result == 0xfa ^ 0x19;
      }
      iVar3 = -4;
      do {
        if (iVar3 == 0) {
          fwrite("Failed to find BMX055 mag\n",0x1a,1,_stderr);
          return false;
        }
        uVar2 = (char)iVar3 + '\x14';
        RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,uVar2,'K','\x01',"");
        RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,0x32);
        bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,uVar2,'@','\x01'
                                  ,&result,"");
        iVar3 = iVar3 + 1;
      } while ((!bVar1) || (result != '2'));
      this->m_magSlaveAddr = (char)iVar3 + '\x13';
      RTIMU::setCalibrationData(&this->super_RTIMU);
      bVar1 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
      if ((bVar1) &&
         (((bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                       this->m_gyroSlaveAddr,'>','@',
                                       "Failed to set BMX055 FIFO config"), bVar1 &&
           (bVar1 = setGyroSampleRate(this), bVar1)) && (bVar1 = setGyroFSR(this), bVar1)))) {
        RTIMU::gyroBiasInit(&this->super_RTIMU);
        bVar1 = setAccelSampleRate(this);
        if ((bVar1) && (bVar1 = setAccelFSR(this), bVar1)) {
          magInitTrimRegisters(this);
          setMagPreset(this);
          puts("BMX055 init complete");
          fflush(_stdout);
          return true;
        }
      }
    }
    else {
      fprintf(_stderr,"Incorrect BMX055 id %d\n");
    }
  }
  return false;
}

Assistant:

bool RTIMUBMX055::IMUInit()
{
    unsigned char result;

    m_firstTime = true;

    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_gyroSlaveAddr = m_settings->m_I2CSlaveAddress;

    if (!m_settings->HALRead(m_gyroSlaveAddr, BMX055_GYRO_WHO_AM_I, 1, &result, "Failed to read BMX055 gyro id"))
        return false;

    if (result !=  BMX055_GYRO_ID) {
        HAL_ERROR1("Incorrect BMX055 id %d\n", result);
        return false;
    }

    // work out accel address

    if (m_settings->HALRead(BMX055_ACCEL_ADDRESS0, BMX055_ACCEL_WHO_AM_I, 1, &result, "")) {
        if (result == BMX055_ACCEL_ID) {
            m_accelSlaveAddr = BMX055_ACCEL_ADDRESS0;
        } else {
            m_accelSlaveAddr = BMX055_ACCEL_ADDRESS1;
        }
    }

    // work out mag address

    int magAddr;

    for (magAddr = BMX055_MAG_ADDRESS0; magAddr <= BMX055_MAG_ADDRESS3; magAddr++) {

        // have to enable chip to get id...

        m_settings->HALWrite(magAddr, BMX055_MAG_POWER, 1, "");

        m_settings->delayMs(50);

        if (m_settings->HALRead(magAddr, BMX055_MAG_WHO_AM_I, 1, &result, "")) {
            if (result == BMX055_MAG_ID) {
                m_magSlaveAddr = magAddr;
                break;
            }
        }
    }

    if (magAddr > BMX055_MAG_ADDRESS3) {
        HAL_ERROR("Failed to find BMX055 mag\n");
        return false;
    }

    setCalibrationData();

    //  enable the I2C bus

    if (!m_settings->HALOpen())
        return false;

    //  Set up the gyro

    if (!m_settings->HALWrite(m_gyroSlaveAddr, BMX055_GYRO_FIFO_CONFIG_1, 0x40, "Failed to set BMX055 FIFO config"))
        return false;

    if (!setGyroSampleRate())
            return false;

    if (!setGyroFSR())
            return false;

    gyroBiasInit();

    //  set up the accel

    if (!setAccelSampleRate())
            return false;

    if (!setAccelFSR())
            return false;


    //  set up the mag

    magInitTrimRegisters();
    setMagPreset();

    HAL_INFO("BMX055 init complete\n");
    return true;
}